

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O2

void __thiscall
llvm::ErrorList::ErrorList
          (ErrorList *this,
          unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *Payload1,
          unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *Payload2)

{
  ErrorInfoBase *pEVar1;
  int iVar2;
  
  (this->super_ErrorInfo<llvm::ErrorList,_llvm::ErrorInfoBase>).super_ErrorInfoBase.
  _vptr_ErrorInfoBase = (_func_int **)&PTR__ErrorList_00e23768;
  (this->Payloads).
  super__Vector_base<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Payloads).
  super__Vector_base<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Payloads).
  super__Vector_base<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pEVar1 = (Payload1->_M_t).
           super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>.
           _M_t.
           super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
           super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl;
  iVar2 = (*pEVar1->_vptr_ErrorInfoBase[6])(pEVar1,&ID);
  if ((char)iVar2 == '\0') {
    pEVar1 = (Payload2->_M_t).
             super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>.
             _M_t.
             super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>
             .super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl;
    iVar2 = (*pEVar1->_vptr_ErrorInfoBase[6])(pEVar1,&ID);
    if ((char)iVar2 == '\0') {
      std::
      vector<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>,std::allocator<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>>>
      ::emplace_back<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>>
                ((vector<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>,std::allocator<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>>>
                  *)&this->Payloads,Payload1);
      std::
      vector<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>,std::allocator<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>>>
      ::emplace_back<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>>
                ((vector<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>,std::allocator<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>>>
                  *)&this->Payloads,Payload2);
      return;
    }
  }
  __assert_fail("!Payload1->isA<ErrorList>() && !Payload2->isA<ErrorList>() && \"ErrorList constructor payloads should be singleton errors\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/Support/Error.h"
                ,0x182,
                "llvm::ErrorList::ErrorList(std::unique_ptr<ErrorInfoBase>, std::unique_ptr<ErrorInfoBase>)"
               );
}

Assistant:

ErrorList(std::unique_ptr<ErrorInfoBase> Payload1,
            std::unique_ptr<ErrorInfoBase> Payload2) {
    assert(!Payload1->isA<ErrorList>() && !Payload2->isA<ErrorList>() &&
           "ErrorList constructor payloads should be singleton errors");
    Payloads.push_back(std::move(Payload1));
    Payloads.push_back(std::move(Payload2));
  }